

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_digests.c
# Opt level: O3

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests,char *value,size_t len)

{
  h2o_vector_t *vector;
  long *plVar1;
  ulong *puVar2;
  h2o_cache_digests_frame_vector_t *v;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  char *target_00;
  long lVar9;
  h2o_cache_digests_t *phVar10;
  int iVar11;
  uint uVar12;
  ulong new_capacity;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  byte *pbVar16;
  char *target;
  byte *pbVar17;
  void *pvVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  h2o_iovec_t hVar23;
  size_t token_len;
  size_t gcs_base64_len;
  h2o_iovec_t iter;
  h2o_iovec_t token_value;
  int local_ac;
  size_t local_98;
  char *local_90;
  h2o_vector_t local_88;
  ulong uStack_70;
  size_t local_68;
  h2o_iovec_t local_60;
  ulong local_50;
  long local_48;
  h2o_iovec_t local_40;
  
  local_60.base = value;
  local_60.len = len;
  pcVar8 = h2o_next_token(&local_60,0x3b,&local_68,(h2o_iovec_t *)0x0);
joined_r0x0014bfc5:
  if (pcVar8 == (char *)0x0) {
    return;
  }
  target_00 = h2o_next_token(&local_60,0x3b,&local_98,&local_40);
  if (target_00 == (char *)0x0) {
    bVar6 = true;
    lVar21 = 0;
    local_ac = 0;
LAB_0014c153:
    local_88.capacity = 0;
    uStack_70 = 0;
    local_88.entries = (void *)0x0;
    local_88.size = 0;
    hVar23 = h2o_decode_base64url((h2o_mem_pool_t *)0x0,pcVar8,local_68);
    pcVar8 = hVar23.base;
    pvVar18 = (void *)0x0;
    if (pcVar8 != (char *)0x0) {
      pbVar16 = (byte *)(pcVar8 + -1);
      pbVar17 = (byte *)(pcVar8 + hVar23.len);
      uVar20 = 0;
      iVar11 = -5;
      iVar7 = 0;
      do {
        local_48 = lVar21;
        if (uVar20 == 0) {
          pbVar16 = pbVar16 + 1;
          uVar20 = 8;
          if (pbVar16 == pbVar17) goto LAB_0014c38b;
        }
        uVar20 = uVar20 - 1;
        iVar7 = (uint)((*pbVar16 >> (uVar20 & 0x1f) & 1) != 0) + iVar7 * 2;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 0);
      iVar11 = -5;
      uVar22 = 0;
      do {
        local_90 = pcVar8;
        if (uVar20 == 0) {
          pbVar16 = pbVar16 + 1;
          uVar20 = 8;
          if (pbVar16 == pbVar17) {
            pvVar18 = (void *)0x0;
            goto LAB_0014c396;
          }
        }
        uVar20 = uVar20 - 1;
        uVar22 = (uint)((*pbVar16 >> (uVar20 & 0x1f) & 1) != 0) + uVar22 * 2;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 0);
      uStack_70 = CONCAT44(uStack_70._4_4_,iVar7 + uVar22);
      uVar13 = (ulong)uVar22;
      uVar19 = 0xffffffffffffffff;
      pvVar18 = (void *)0x0;
      while( true ) {
        lVar21 = local_48;
        pcVar8 = local_90;
        lVar9 = 0;
        while( true ) {
          if (uVar20 == 0) {
            pbVar16 = pbVar16 + 1;
            uVar20 = 8;
            if (pbVar16 == pbVar17) goto LAB_0014c2e9;
          }
          uVar20 = uVar20 - 1;
          if ((*pbVar16 >> (uVar20 & 0x1f) & 1) != 0) break;
          lVar9 = lVar9 + 1;
        }
        lVar14 = 0;
        for (uVar12 = uVar22; uVar12 != 0; uVar12 = uVar12 - 1) {
          if (uVar20 == 0) {
            pbVar16 = pbVar16 + 1;
            uVar20 = 8;
            if (pbVar16 == pbVar17) goto LAB_0014c2e9;
          }
          uVar20 = uVar20 - 1;
          lVar14 = (ulong)((*pbVar16 >> (uVar20 & 0x1f) & 1) != 0) + lVar14 * 2;
        }
        uVar19 = uVar19 + (lVar9 << ((byte)uVar13 & 0x3f)) + lVar14 + 1;
        if (uVar19 >> ((byte)uStack_70 & 0x3f) != 0) break;
        new_capacity = local_88.size + 1;
        if (local_88.capacity < new_capacity) {
          local_50 = uVar13;
          h2o_vector__expand((h2o_mem_pool_t *)0x0,&local_88,8,new_capacity);
          new_capacity = local_88.size + 1;
          pvVar18 = local_88.entries;
          uVar13 = local_50;
        }
        *(ulong *)((long)pvVar18 + local_88.size * 8) = uVar19;
        local_88.size = new_capacity;
      }
    }
    goto LAB_0014c396;
  }
  bVar5 = false;
  local_ac = 0;
  bVar3 = false;
  bVar4 = false;
  do {
    if (local_98 == 5) {
      iVar7 = h2o__lcstris_core(target_00,"reset",5);
      if (iVar7 == 0) goto LAB_0014c04c;
      bVar4 = true;
    }
    else if (local_98 == 1) {
      if (*target_00 == ',') {
        bVar6 = false;
        goto LAB_0014c0ea;
      }
LAB_0014c0a9:
      bVar5 = true;
    }
    else {
LAB_0014c04c:
      if ((local_98 == 10) && (iVar7 = h2o__lcstris_core(target_00,"validators",10), iVar7 != 0)) {
        bVar3 = true;
      }
      else {
        if (local_98 != 8) goto LAB_0014c0a9;
        iVar7 = h2o__lcstris_core(target_00,"complete",8);
        if (iVar7 == 0) {
          bVar5 = true;
        }
        else {
          local_ac = 1;
        }
      }
    }
    target_00 = h2o_next_token(&local_60,0x3b,&local_98,&local_40);
  } while (target_00 != (char *)0x0);
  bVar6 = true;
LAB_0014c0ea:
  lVar21 = 0x18;
  if (!bVar3) {
    lVar21 = 0;
  }
  if ((bVar4) &&
     (v = (h2o_cache_digests_frame_vector_t *)*digests, v != (h2o_cache_digests_frame_vector_t *)0x0
     )) {
    dispose_frame_vector(v);
    dispose_frame_vector(v + 1);
    free(v);
    *digests = (h2o_cache_digests_t *)0x0;
  }
  if (!bVar5) goto LAB_0014c153;
  if (bVar6) {
    return;
  }
  goto LAB_0014c3a8;
LAB_0014c2e9:
  phVar10 = *digests;
  if (phVar10 == (h2o_cache_digests_t *)0x0) {
    phVar10 = (h2o_cache_digests_t *)calloc(1,0x38);
    if (phVar10 == (h2o_cache_digests_t *)0x0) {
      h2o__fatal(
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h:330:no memory"
                );
    }
    *digests = phVar10;
  }
  vector = (h2o_vector_t *)((long)&(phVar10->fresh).url_only.entries + lVar21);
  sVar15 = *(size_t *)((long)&(phVar10->fresh).url_only.size + lVar21);
  uVar13 = sVar15 + 1;
  if (*(ulong *)((long)&(phVar10->fresh).url_only.capacity + lVar21) < uVar13) {
    h2o_vector__expand((h2o_mem_pool_t *)0x0,vector,0x20,uVar13);
    sVar15 = vector->size;
    uVar13 = sVar15 + 1;
  }
  pvVar18 = vector->entries;
  vector->size = uVar13;
  puVar2 = (ulong *)((long)pvVar18 + sVar15 * 0x20 + 0x10);
  *puVar2 = local_88.capacity;
  puVar2[1] = uStack_70;
  plVar1 = (long *)((long)pvVar18 + sVar15 * 0x20);
  *plVar1 = (long)local_88.entries;
  plVar1[1] = local_88.size;
  local_88.entries = (void *)0x0;
  local_88.size = 0;
  local_88.capacity = 0;
  uStack_70 = 0;
  ((*digests)->fresh).complete = local_ac;
LAB_0014c38b:
  pvVar18 = (void *)0x0;
LAB_0014c396:
  free(pvVar18);
  free(pcVar8);
  if (bVar6) {
    return;
  }
LAB_0014c3a8:
  pcVar8 = h2o_next_token(&local_60,0x3b,&local_68,(h2o_iovec_t *)0x0);
  goto joined_r0x0014bfc5;
}

Assistant:

void h2o_cache_digests_load_header(h2o_cache_digests_t **digests, const char *value, size_t len)
{
    h2o_iovec_t iter = h2o_iovec_init(value, len);
    const char *token;
    size_t token_len;

    do {
        const char *gcs_base64;
        size_t gcs_base64_len;
        int reset = 0, validators = 0, complete = 0, skip = 0;
        h2o_iovec_t token_value;

        if ((gcs_base64 = h2o_next_token(&iter, ';', &gcs_base64_len, NULL)) == NULL)
            return;
        while ((token = h2o_next_token(&iter, ';', &token_len, &token_value)) != NULL &&
               !h2o_memis(token, token_len, H2O_STRLIT(","))) {
            if (h2o_lcstris(token, token_len, H2O_STRLIT("reset"))) {
                reset = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("validators"))) {
                validators = 1;
            } else if (h2o_lcstris(token, token_len, H2O_STRLIT("complete"))) {
                complete = 1;
            } else {
                skip = 1;
            }
        }

        if (reset && *digests != NULL) {
            h2o_cache_digests_destroy(*digests);
            *digests = NULL;
        }

        if (skip) {
            /* not supported for the time being */
        } else {
            load_digest(digests, gcs_base64, gcs_base64_len, validators, complete);
        }
    } while (token != NULL);
}